

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QTableWidgetSelectionRange>::emplace<QTableWidgetSelectionRange>
          (QMovableArrayOps<QTableWidgetSelectionRange> *this,qsizetype i,
          QTableWidgetSelectionRange *args)

{
  qsizetype *pqVar1;
  QTableWidgetSelectionRange **ppQVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Data *pDVar7;
  QTableWidgetSelectionRange *pQVar8;
  qsizetype qVar9;
  long in_FS_OFFSET;
  bool bVar10;
  Inserter local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar7 = (this->super_QGenericArrayOps<QTableWidgetSelectionRange>).
           super_QArrayDataPointer<QTableWidgetSelectionRange>.d;
  if ((pDVar7 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0053d602:
    iVar3 = args->m_top;
    iVar4 = args->m_left;
    iVar5 = args->m_bottom;
    iVar6 = args->m_right;
    bVar10 = (this->super_QGenericArrayOps<QTableWidgetSelectionRange>).
             super_QArrayDataPointer<QTableWidgetSelectionRange>.size != 0;
    QArrayDataPointer<QTableWidgetSelectionRange>::detachAndGrow
              ((QArrayDataPointer<QTableWidgetSelectionRange> *)this,(uint)(i == 0 && bVar10),1,
               (QTableWidgetSelectionRange **)0x0,
               (QArrayDataPointer<QTableWidgetSelectionRange> *)0x0);
    if (i != 0 || !bVar10) {
      Inserter::Inserter(&local_60,(QArrayDataPointer<QTableWidgetSelectionRange> *)this,i,1);
      (local_60.displaceFrom)->m_top = iVar3;
      (local_60.displaceFrom)->m_left = iVar4;
      (local_60.displaceFrom)->m_bottom = iVar5;
      (local_60.displaceFrom)->m_right = iVar6;
      (local_60.data)->size = (local_60.data)->size + local_60.nInserts;
      goto LAB_0053d69e;
    }
    pQVar8 = (this->super_QGenericArrayOps<QTableWidgetSelectionRange>).
             super_QArrayDataPointer<QTableWidgetSelectionRange>.ptr;
    pQVar8[-1].m_top = iVar3;
    pQVar8[-1].m_left = iVar4;
    pQVar8[-1].m_bottom = iVar5;
    pQVar8[-1].m_right = iVar6;
    (this->super_QGenericArrayOps<QTableWidgetSelectionRange>).
    super_QArrayDataPointer<QTableWidgetSelectionRange>.ptr = pQVar8 + -1;
  }
  else {
    if ((this->super_QGenericArrayOps<QTableWidgetSelectionRange>).
        super_QArrayDataPointer<QTableWidgetSelectionRange>.size != i) {
LAB_0053d5f9:
      if (i == 0) {
        qVar9 = QArrayDataPointer<QTableWidgetSelectionRange>::freeSpaceAtBegin
                          ((QArrayDataPointer<QTableWidgetSelectionRange> *)this);
        if (qVar9 != 0) {
          pQVar8 = (this->super_QGenericArrayOps<QTableWidgetSelectionRange>).
                   super_QArrayDataPointer<QTableWidgetSelectionRange>.ptr;
          iVar3 = args->m_left;
          iVar4 = args->m_bottom;
          iVar5 = args->m_right;
          pQVar8[-1].m_top = args->m_top;
          pQVar8[-1].m_left = iVar3;
          pQVar8[-1].m_bottom = iVar4;
          pQVar8[-1].m_right = iVar5;
          ppQVar2 = &(this->super_QGenericArrayOps<QTableWidgetSelectionRange>).
                     super_QArrayDataPointer<QTableWidgetSelectionRange>.ptr;
          *ppQVar2 = *ppQVar2 + -1;
          goto LAB_0053d65f;
        }
      }
      goto LAB_0053d602;
    }
    qVar9 = QArrayDataPointer<QTableWidgetSelectionRange>::freeSpaceAtEnd
                      ((QArrayDataPointer<QTableWidgetSelectionRange> *)this);
    if (qVar9 == 0) goto LAB_0053d5f9;
    iVar3 = args->m_left;
    iVar4 = args->m_bottom;
    iVar5 = args->m_right;
    pQVar8 = (this->super_QGenericArrayOps<QTableWidgetSelectionRange>).
             super_QArrayDataPointer<QTableWidgetSelectionRange>.ptr +
             (this->super_QGenericArrayOps<QTableWidgetSelectionRange>).
             super_QArrayDataPointer<QTableWidgetSelectionRange>.size;
    pQVar8->m_top = args->m_top;
    pQVar8->m_left = iVar3;
    pQVar8->m_bottom = iVar4;
    pQVar8->m_right = iVar5;
  }
LAB_0053d65f:
  pqVar1 = &(this->super_QGenericArrayOps<QTableWidgetSelectionRange>).
            super_QArrayDataPointer<QTableWidgetSelectionRange>.size;
  *pqVar1 = *pqVar1 + 1;
LAB_0053d69e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }